

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TexSubImage2DAlignCase::createTexture(TexSubImage2DAlignCase *this)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  int iVar4;
  int height;
  int iVar5;
  reference pvVar6;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  PixelBufferAccess local_c8;
  int local_9c;
  int rowPitch;
  Vector<float,_4> local_88;
  PixelBufferAccess local_78;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  TextureFormat TStack_20;
  deUint32 tex;
  TextureFormat fmt;
  TexSubImage2DAlignCase *this_local;
  
  TStack_20 = (this->super_TextureSpecCase).m_texFormat;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  fmt = (TextureFormat)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  iVar5 = tcu::TextureFormat::getPixelSize(&stack0xffffffffffffffe0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
             (long)(iVar5 * (this->super_TextureSpecCase).m_width *
                   (this->super_TextureSpecCase).m_height));
  iVar5 = (this->super_TextureSpecCase).m_width;
  iVar1 = (this->super_TextureSpecCase).m_height;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_78,&stack0xffffffffffffffe0,iVar5,iVar1,1,pvVar6)
  ;
  tcu::Vector<float,_4>::Vector(&local_88,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff68,1.0);
  tcu::fillWithComponentGradients(&local_78,&local_88,(Vec4 *)&stack0xffffffffffffff68);
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  dVar2 = this->m_format;
  iVar5 = (this->super_TextureSpecCase).m_width;
  iVar1 = (this->super_TextureSpecCase).m_height;
  dVar3 = this->m_dataType;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,0,dVar2,iVar5,iVar1,0,dVar2,
             dVar3,pvVar6);
  local_9c = getRowPitch(&stack0xffffffffffffffe0,this->m_subW,this->m_alignment);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
             (long)(local_9c * this->m_subH));
  iVar4 = local_9c;
  iVar5 = this->m_subW;
  iVar1 = this->m_subH;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_c8,&stack0xffffffffffffffe0,iVar5,iVar1,1,iVar4,0,pvVar6);
  tcu::Vector<float,_4>::Vector(&local_d8,1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_e8,0.0,1.0,0.0,1.0);
  tcu::fillWithGrid(&local_c8,4,&local_d8,&local_e8);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,this->m_alignment);
  iVar5 = this->m_subX;
  iVar1 = this->m_subY;
  iVar4 = this->m_subW;
  height = this->m_subH;
  dVar2 = this->m_format;
  dVar3 = this->m_dataType;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  sglr::ContextWrapper::glTexSubImage2D
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,0,iVar5,iVar1,iVar4,height,
             dVar2,dVar3,pvVar6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		// Specify base level.
		data.resize(fmt.getPixelSize()*m_width*m_height);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(fmt, m_width, m_height, 1, &data[0]), Vec4(0.0f), Vec4(1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		glTexImage2D(GL_TEXTURE_2D, 0, m_format, m_width, m_height, 0, m_format, m_dataType, &data[0]);

		// Re-specify subrectangle.
		int rowPitch = getRowPitch(fmt, m_subW, m_alignment);
		data.resize(rowPitch*m_subH);
		tcu::fillWithGrid(tcu::PixelBufferAccess(fmt, m_subW, m_subH, 1, rowPitch, 0, &data[0]), 4, Vec4(1.0f, 0.0f, 0.0f, 1.0f), Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);
		glTexSubImage2D(GL_TEXTURE_2D, 0, m_subX, m_subY, m_subW, m_subH, m_format, m_dataType, &data[0]);
	}